

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_89(QPDF *pdf,char *arg2)

{
  QPDFObjectHandle null;
  QPDFObjectHandle local_60;
  long local_50 [2];
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined1 local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  QPDFObjectHandle::newNull();
  QPDF::getTrailer();
  QPDFObjectHandle::appendItem(&local_60);
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDF::getRoot();
  QPDFObjectHandle::appendItem(&local_60);
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDF::getObjectByID((int)local_40,(int)pdf);
  local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/X","");
  QPDFObjectHandle::replaceKey(local_40,&local_60);
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_50) {
    operator_delete(local_60.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_50[0] + 1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  QPDF::getObjectByID((int)local_20,(int)pdf);
  QPDFObjectHandle::getArrayItem((int)local_40);
  local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/X","");
  QPDFObjectHandle::replaceKey(local_40,&local_60);
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_50) {
    operator_delete(local_60.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_50[0] + 1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

static void
test_89(QPDF& pdf, char const* arg2)
{
    // Generate object warning with json-input. Crafted to work with
    // manual-qpdf-json.json.
    auto null = QPDFObjectHandle::newNull();
    pdf.getTrailer().appendItem(null);
    pdf.getRoot().appendItem(null);
    pdf.getObjectByID(5, 0).replaceKey("/X", null);
    pdf.getObjectByID(5, 0).getArrayItem(0).replaceKey("/X", null);
}